

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O1

Json * __thiscall JFSON::JsonObject::operator[](JsonObject *this,string *key)

{
  const_iterator cVar1;
  Json *pJVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>
          ::find(&(this->
                  super_Value<(JFSON::Json::Type)5,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>_>
                  ).m_value._M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->
       super_Value<(JFSON::Json::Type)5,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JFSON::Json>_>_>_>
       ).m_value._M_t._M_impl.super__Rb_tree_header) {
    static_null();
    pJVar2 = &static_null::json_null;
  }
  else {
    pJVar2 = (Json *)(cVar1._M_node + 2);
  }
  return pJVar2;
}

Assistant:

const Json & JsonObject::operator[] (const string &key) const {
    auto iter = m_value.find(key);
    return (iter == m_value.end()) ? static_null() : iter->second;
}